

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O1

LexChar lex_more(LexState *ls)

{
  ulong in_RAX;
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  ulong local_18;
  
  local_18 = in_RAX;
  pbVar1 = (byte *)(*ls->rfunc)(ls->L,ls->rdata,&local_18);
  uVar2 = 0xffffffff;
  if (local_18 != 0 && pbVar1 != (byte *)0x0) {
    if (0x7ffffeff < local_18) {
      if (local_18 != 0xffffffffffffffff) {
        lj_err_mem(ls->L);
      }
      pbVar3 = (byte *)0xffffffff80000100;
      if ((byte *)0xffffffff80000100 < pbVar1) {
        pbVar3 = pbVar1;
      }
      local_18 = ~(ulong)pbVar3;
      ls->endmark = 1;
    }
    ls->pe = (char *)(pbVar1 + local_18);
    ls->p = (char *)(pbVar1 + 1);
    uVar2 = (uint)*pbVar1;
  }
  return uVar2;
}

Assistant:

static LJ_NOINLINE LexChar lex_more(LexState *ls)
{
  size_t sz;
  const char *p = ls->rfunc(ls->L, ls->rdata, &sz);
  if (p == NULL || sz == 0) return LEX_EOF;
  if (sz >= LJ_MAX_BUF) {
    if (sz != ~(size_t)0) lj_err_mem(ls->L);
    sz = ~(uintptr_t)0 - (uintptr_t)p;
    if (sz >= LJ_MAX_BUF) sz = LJ_MAX_BUF-1;
    ls->endmark = 1;
  }
  ls->pe = p + sz;
  ls->p = p + 1;
  return (LexChar)(uint8_t)p[0];
}